

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnExpr(BinaryReaderInterp *this)

{
  Result RVar1;
  undefined8 in_RAX;
  Enum EVar2;
  Index keep_count;
  Index drop_count;
  
  _keep_count = in_RAX;
  RVar1 = GetReturnDropKeepCount(this,&drop_count,&keep_count);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = SharedValidator::OnReturn
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc)
    ;
    if (RVar1.enum_ != Error) {
      Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
      Istream::Emit(this->istream_,Return);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnReturnExpr() {
  Index drop_count, keep_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(validator_.OnReturn(loc));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::Return);
  return Result::Ok;
}